

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O1

fsg_model_t * fsg_model_read(FILE *fp,logmath_t *lmath,float32 lw)

{
  hash_table_t *phVar1;
  int32 iVar2;
  int iVar3;
  char *pcVar4;
  hash_iter_t *phVar5;
  fsg_model_t *fsg;
  fsg_link_t *ptr;
  char **ppcVar6;
  glist_t pgVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  size_t n_elem;
  ulong in_R8;
  ulong uVar11;
  float fVar12;
  double dVar13;
  int32 lineno;
  char **wordptr;
  int32 j;
  int32 i;
  char *lineptr;
  ulong local_68;
  hash_table_t *local_60;
  FILE *local_58;
  int32 wid;
  ulong local_48;
  logmath_t *local_40;
  int n_state;
  
  local_68 = CONCAT44(local_68._4_4_,lw);
  lineno = 0;
  local_58 = fp;
  local_40 = lmath;
  local_60 = hash_table_new(0x20,0);
  wordptr = (char **)0x0;
  lineptr = (char *)0x0;
  do {
    iVar2 = nextline_str2words(local_58,&lineno,&lineptr,&wordptr);
    ppcVar6 = wordptr;
    if (iVar2 < 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
              ,0x21f,"%s declaration missing\n","FSG_BEGIN");
      goto LAB_0010ae4b;
    }
    iVar3 = strcmp(*wordptr,"FSG_BEGIN");
  } while (iVar3 != 0);
  if (iVar2 < 3) {
    if (iVar2 == 2) {
      pcVar4 = ppcVar6[1];
      iVar3 = 0x230;
    }
    else {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
              ,0x233,"FSG name is missing\n");
      pcVar4 = "unknown";
      iVar3 = 0x234;
    }
    pcVar4 = __ckd_salloc__(pcVar4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                            ,iVar3);
    iVar2 = nextline_str2words(local_58,&lineno,&lineptr,&wordptr);
    ppcVar6 = wordptr;
    if (iVar2 == 2) {
      pcVar8 = *wordptr;
      iVar3 = strcmp(pcVar8,"N");
      if (((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"NUM_STATES"), iVar3 == 0)) &&
         (iVar3 = __isoc99_sscanf(ppcVar6[1],"%d",&n_state), 0 < n_state && iVar3 == 1)) {
        fsg = fsg_model_init(pcVar4,local_40,(float32)local_68,n_state);
        ckd_free(pcVar4);
        iVar2 = nextline_str2words(local_58,&lineno,&lineptr,&wordptr);
        ppcVar6 = wordptr;
        if (iVar2 == 2) {
          pcVar4 = *wordptr;
          iVar3 = strcmp(pcVar4,"S");
          if ((iVar3 != 0) && (iVar3 = strcmp(pcVar4,"START_STATE"), iVar3 != 0)) goto LAB_0010b372;
          iVar3 = __isoc99_sscanf(ppcVar6[1],"%d",&fsg->start_state);
          if ((iVar3 != 1) || ((iVar3 = fsg->start_state, iVar3 < 0 || (fsg->n_state <= iVar3))))
          goto LAB_0010b372;
          iVar2 = nextline_str2words(local_58,&lineno,&lineptr,&wordptr);
          ppcVar6 = wordptr;
          if (iVar2 == 2) {
            pcVar4 = *wordptr;
            iVar3 = strcmp(pcVar4,"F");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar4,"FINAL_STATE"), iVar3 == 0)) {
              iVar3 = __isoc99_sscanf(ppcVar6[1],"%d",&fsg->final_state);
              if ((iVar3 == 1) && ((iVar3 = fsg->final_state, -1 < iVar3 && (iVar3 < fsg->n_state)))
                 ) {
                uVar11 = 0;
                local_68 = 0;
                pgVar7 = (glist_t)0x0;
                local_48 = 0;
                do {
                  iVar2 = nextline_str2words(local_58,&lineno,&lineptr,&wordptr);
                  ppcVar6 = wordptr;
                  if (iVar2 < 1) {
                    lVar9 = 0x26e;
LAB_0010b18f:
                    in_R8 = (ulong)(uint)lineno;
                    pcVar4 = "Line[%d]: transition or FSG_END statement expected\n";
LAB_0010b20f:
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                            ,lVar9,pcVar4);
                    iVar3 = 4;
                  }
                  else {
                    pcVar4 = *wordptr;
                    iVar3 = strcmp(pcVar4,"FSG_END");
                    if (iVar3 != 0) {
                      iVar3 = strcmp(pcVar4,"T");
                      if ((iVar3 != 0) && (iVar3 = strcmp(pcVar4,"TRANSITION"), iVar3 != 0)) {
                        lVar9 = 0x28f;
                        goto LAB_0010b18f;
                      }
                      if (((((iVar2 - 6U < 0xfffffffe) ||
                            (iVar3 = __isoc99_sscanf(ppcVar6[1],"%d",&i), iVar3 != 1)) ||
                           (iVar3 = __isoc99_sscanf(ppcVar6[2],"%d",&j), i < 0 || iVar3 != 1)) ||
                          ((fsg->n_state <= i || (j < 0)))) || (fsg->n_state <= j)) {
                        in_R8 = (ulong)(uint)lineno;
                        lVar9 = 0x281;
                        pcVar4 = 
                        "Line[%d]: transition spec malformed; Expecting: from-state to-state trans-prob [word]\n"
                        ;
                      }
                      else {
                        dVar13 = atof_c(ppcVar6[3]);
                        fVar12 = (float)dVar13;
                        if ((0.0 < fVar12) && (fVar12 <= 1.0)) {
                          iVar3 = logmath_log(local_40,(float64)(double)fVar12);
                          iVar3 = (int)((float)iVar3 * (float)fsg->lw);
                          if (iVar2 < 5) {
                            iVar2 = fsg_model_tag_trans_add(fsg,i,j,iVar3,(int32)in_R8);
                            iVar3 = 0;
                            if (iVar2 == 1) {
                              local_68 = (ulong)((int)local_68 + 1);
                              ptr = fsg_model_null_trans(fsg,i,j);
                              pgVar7 = glist_add_ptr(pgVar7,ptr);
                            }
                          }
                          else {
                            iVar2 = hash_table_lookup_int32(local_60,ppcVar6[4],&wid);
                            if (iVar2 < 0) {
                              pcVar4 = __ckd_salloc__(ppcVar6[4],
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                                  ,0x298);
                              iVar10 = (int)local_48;
                              hash_table_enter(local_60,pcVar4,(void *)(long)iVar10);
                              local_48 = (ulong)(iVar10 + 1);
                              wid = iVar10;
                            }
                            in_R8 = (ulong)(uint)wid;
                            fsg_model_trans_add(fsg,i,j,iVar3,wid);
                            uVar11 = (ulong)((int)uVar11 + 1);
                            iVar3 = 0;
                          }
                          goto LAB_0010b222;
                        }
                        in_R8 = (ulong)(uint)lineno;
                        lVar9 = 0x289;
                        pcVar4 = 
                        "Line[%d]: transition spec malformed; Expecting float as transition probability\n"
                        ;
                      }
                      goto LAB_0010b20f;
                    }
                    iVar3 = 5;
                  }
LAB_0010b222:
                  phVar1 = local_60;
                } while (iVar3 == 0);
                if (iVar3 == 1) {
                  return fsg;
                }
                if (iVar3 != 4) {
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                          ,0x2aa,"FSG: %d states, %d unique words, %d transitions (%d null)\n",
                          (ulong)(uint)fsg->n_state,(ulong)(uint)local_60->inuse,uVar11,local_68);
                  iVar3 = phVar1->inuse;
                  fsg->n_word = iVar3;
                  n_elem = (long)iVar3 + 10;
                  fsg->n_word_alloc = (int32)n_elem;
                  ppcVar6 = (char **)__ckd_calloc__(n_elem,8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                                  ,0x2b0);
                  fsg->vocab = ppcVar6;
                  for (phVar5 = hash_table_iter(phVar1); phVar5 != (hash_iter_t *)0x0;
                      phVar5 = hash_table_iter_next(phVar5)) {
                    fsg->vocab[*(int *)&phVar5->ent->val] = phVar5->ent->key;
                  }
                  hash_table_free(local_60);
                  pgVar7 = fsg_model_null_trans_closure(fsg,pgVar7);
                  glist_free(pgVar7);
                  ckd_free(lineptr);
                  ckd_free(wordptr);
                  return fsg;
                }
                pcVar4 = (char *)0x0;
                goto LAB_0010af4c;
              }
            }
          }
          pcVar8 = "Line[%d]: final state declaration line missing or malformed\n";
          lVar9 = 0x261;
        }
        else {
LAB_0010b372:
          pcVar8 = "Line[%d]: start state declaration line missing or malformed\n";
          lVar9 = 0x253;
        }
        pcVar4 = (char *)0x0;
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                ,lVar9,pcVar8,(ulong)(uint)lineno);
        pgVar7 = (glist_t)0x0;
        goto LAB_0010af4c;
      }
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
            ,0x240,"Line[%d]: #states declaration line missing or malformed\n",(ulong)(uint)lineno);
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
            ,0x226,"Line[%d]: malformed FSG_BEGIN declaration\n",(ulong)(uint)lineno);
LAB_0010ae4b:
    pcVar4 = (char *)0x0;
  }
  pgVar7 = (glist_t)0x0;
  fsg = (fsg_model_t *)0x0;
LAB_0010af4c:
  phVar1 = local_60;
  for (phVar5 = hash_table_iter(local_60); phVar5 != (hash_iter_t *)0x0;
      phVar5 = hash_table_iter_next(phVar5)) {
    ckd_free(phVar5->ent->key);
  }
  glist_free(pgVar7);
  hash_table_free(phVar1);
  ckd_free(pcVar4);
  ckd_free(lineptr);
  ckd_free(wordptr);
  fsg_model_free(fsg);
  return (fsg_model_t *)0x0;
}

Assistant:

fsg_model_t *
fsg_model_read(FILE * fp, logmath_t * lmath, float32 lw)
{
    fsg_model_t *fsg;
    hash_table_t *vocab;
    hash_iter_t *itor;
    int32 lastwid;
    char **wordptr;
    char *lineptr;
    char *fsgname;
    int32 lineno;
    int32 n, i, j;
    int n_state, n_trans, n_null_trans;
    glist_t nulls;
    float32 p;

    lineno = 0;
    vocab = hash_table_new(32, FALSE);
    wordptr = NULL;
    lineptr = NULL;
    nulls = NULL;
    fsgname = NULL;
    fsg = NULL;

    /* Scan upto FSG_BEGIN header */
    for (;;) {
        n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
        if (n < 0) {
            E_ERROR("%s declaration missing\n", FSG_MODEL_BEGIN_DECL);
            goto parse_error;
        }

        if ((strcmp(wordptr[0], FSG_MODEL_BEGIN_DECL) == 0)) {
            if (n > 2) {
                E_ERROR("Line[%d]: malformed FSG_BEGIN declaration\n",
                        lineno);
                goto parse_error;
            }
            break;
        }
    }
    /* Save FSG name, or it will get clobbered below :(.
     * If name is missing, try the default.
     */
    if (n == 2) {
        fsgname = ckd_salloc(wordptr[1]);
    }
    else {
        E_WARN("FSG name is missing\n");
        fsgname = ckd_salloc("unknown");
    }

    /* Read #states */
    n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
    if ((n != 2)
        || ((strcmp(wordptr[0], FSG_MODEL_N_DECL) != 0)
            && (strcmp(wordptr[0], FSG_MODEL_NUM_STATES_DECL) != 0))
        || (sscanf(wordptr[1], "%d", &n_state) != 1)
        || (n_state <= 0)) {
        E_ERROR
            ("Line[%d]: #states declaration line missing or malformed\n",
             lineno);
        goto parse_error;
    }

    /* Now create the FSG. */
    fsg = fsg_model_init(fsgname, lmath, lw, n_state);
    ckd_free(fsgname);
    fsgname = NULL;

    /* Read start state */
    n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
    if ((n != 2)
        || ((strcmp(wordptr[0], FSG_MODEL_S_DECL) != 0)
            && (strcmp(wordptr[0], FSG_MODEL_START_STATE_DECL) != 0))
        || (sscanf(wordptr[1], "%d", &(fsg->start_state)) != 1)
        || (fsg->start_state < 0)
        || (fsg->start_state >= fsg->n_state)) {
        E_ERROR
            ("Line[%d]: start state declaration line missing or malformed\n",
             lineno);
        goto parse_error;
    }

    /* Read final state */
    n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
    if ((n != 2)
        || ((strcmp(wordptr[0], FSG_MODEL_F_DECL) != 0)
            && (strcmp(wordptr[0], FSG_MODEL_FINAL_STATE_DECL) != 0))
        || (sscanf(wordptr[1], "%d", &(fsg->final_state)) != 1)
        || (fsg->final_state < 0)
        || (fsg->final_state >= fsg->n_state)) {
        E_ERROR
            ("Line[%d]: final state declaration line missing or malformed\n",
             lineno);
        goto parse_error;
    }

    /* Read transitions */
    lastwid = 0;
    n_trans = n_null_trans = 0;
    for (;;) {
        int32 wid, tprob;

        n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
        if (n <= 0) {
            E_ERROR("Line[%d]: transition or FSG_END statement expected\n",
                    lineno);
            goto parse_error;
        }

        if ((strcmp(wordptr[0], FSG_MODEL_END_DECL) == 0)) {
            break;
        }

        if ((strcmp(wordptr[0], FSG_MODEL_T_DECL) == 0)
            || (strcmp(wordptr[0], FSG_MODEL_TRANSITION_DECL) == 0)) {


            if (((n != 4) && (n != 5))
                || (sscanf(wordptr[1], "%d", &i) != 1)
                || (sscanf(wordptr[2], "%d", &j) != 1)
                || (i < 0) || (i >= fsg->n_state)
                || (j < 0) || (j >= fsg->n_state)) {
                E_ERROR
                    ("Line[%d]: transition spec malformed; Expecting: from-state to-state trans-prob [word]\n",
                     lineno);
                goto parse_error;
            }

            p = atof_c(wordptr[3]);
            if ((p <= 0.0) || (p > 1.0)) {
                E_ERROR
                    ("Line[%d]: transition spec malformed; Expecting float as transition probability\n",
                     lineno);
                goto parse_error;
            }
        }
        else {
            E_ERROR("Line[%d]: transition or FSG_END statement expected\n",
                    lineno);
            goto parse_error;
        }

        tprob = (int32) (logmath_log(lmath, p) * fsg->lw);
        /* Add word to "dictionary". */
        if (n > 4) {
            if (hash_table_lookup_int32(vocab, wordptr[4], &wid) < 0) {
                (void) hash_table_enter_int32(vocab,
                                              ckd_salloc(wordptr[4]),
                                              lastwid);
                wid = lastwid;
                ++lastwid;
            }
            fsg_model_trans_add(fsg, i, j, tprob, wid);
            ++n_trans;
        }
        else {
            if (fsg_model_null_trans_add(fsg, i, j, tprob) == 1) {
                ++n_null_trans;
                nulls =
                    glist_add_ptr(nulls, fsg_model_null_trans(fsg, i, j));
            }
        }
    }

    E_INFO("FSG: %d states, %d unique words, %d transitions (%d null)\n",
           fsg->n_state, hash_table_inuse(vocab), n_trans, n_null_trans);


    /* Now create a string table from the "dictionary" */
    fsg->n_word = hash_table_inuse(vocab);
    fsg->n_word_alloc = fsg->n_word + 10;       /* Pad it a bit. */
    fsg->vocab = ckd_calloc(fsg->n_word_alloc, sizeof(*fsg->vocab));
    for (itor = hash_table_iter(vocab); itor;
         itor = hash_table_iter_next(itor)) {
        char const *word = hash_entry_key(itor->ent);
        int32 wid = (int32) (size_t) hash_entry_val(itor->ent);
        fsg->vocab[wid] = (char *) word;
    }
    hash_table_free(vocab);

    /* Do transitive closure on null transitions.  FIXME: This is
     * actually quite inefficient as it *creates* a lot of new links
     * as opposed to just *calculating* the epsilon-closure for each
     * state.  Ideally we would epsilon-remove or determinize the FSG
     * (but note that tag transitions are not really epsilons...) */
    nulls = fsg_model_null_trans_closure(fsg, nulls);
    glist_free(nulls);

    ckd_free(lineptr);
    ckd_free(wordptr);

    return fsg;

  parse_error:
    for (itor = hash_table_iter(vocab); itor;
         itor = hash_table_iter_next(itor))
        ckd_free((char *) hash_entry_key(itor->ent));
    glist_free(nulls);
    hash_table_free(vocab);
    ckd_free(fsgname);
    ckd_free(lineptr);
    ckd_free(wordptr);
    fsg_model_free(fsg);
    return NULL;
}